

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O0

uint __thiscall RtApi::getDefaultInputDevice(RtApi *this)

{
  size_type sVar1;
  reference pvVar2;
  uint local_20;
  uint local_1c;
  uint i_1;
  uint i;
  RtApi *this_local;
  
  sVar1 = std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::size
                    (&this->deviceList_);
  if (sVar1 == 0) {
    (*this->_vptr_RtApi[0xb])();
  }
  local_1c = 0;
  while( true ) {
    sVar1 = std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::size
                      (&this->deviceList_);
    if (sVar1 <= local_1c) {
      local_20 = 0;
      while( true ) {
        sVar1 = std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::size
                          (&this->deviceList_);
        if (sVar1 <= local_20) {
          return 0;
        }
        pvVar2 = std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::operator[]
                           (&this->deviceList_,(ulong)local_20);
        if (pvVar2->inputChannels != 0) break;
        local_20 = local_20 + 1;
      }
      pvVar2 = std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::operator[]
                         (&this->deviceList_,(ulong)local_20);
      pvVar2->isDefaultInput = true;
      pvVar2 = std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::operator[]
                         (&this->deviceList_,(ulong)local_20);
      return pvVar2->ID;
    }
    pvVar2 = std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::operator[]
                       (&this->deviceList_,(ulong)local_1c);
    if ((pvVar2->isDefaultInput & 1U) != 0) break;
    local_1c = local_1c + 1;
  }
  pvVar2 = std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::operator[]
                     (&this->deviceList_,(ulong)local_1c);
  return pvVar2->ID;
}

Assistant:

unsigned int RtApi :: getDefaultInputDevice( void )
{
  // Should be reimplemented in subclasses if necessary.
  if ( deviceList_.size() == 0 ) probeDevices();
  for ( unsigned int i = 0; i < deviceList_.size(); i++ ) {
    if ( deviceList_[i].isDefaultInput )
      return deviceList_[i].ID;
  }

  // If not found, find the first device with input channels, set it
  // as the default, and return the ID.
  for ( unsigned int i = 0; i < deviceList_.size(); i++ ) {
    if ( deviceList_[i].inputChannels > 0 ) {
      deviceList_[i].isDefaultInput = true;
      return deviceList_[i].ID;
    }
  }

  return 0;
}